

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_int_test.cpp
# Opt level: O0

void __thiscall
reflect_value_cast_int_test_int_to_double_cast_Test::TestBody
          (reflect_value_cast_int_test_int_to_double_cast_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  int i;
  value v;
  double *in_stack_ffffffffffffff90;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  AssertHelper in_stack_ffffffffffffffa8;
  Message local_50 [3];
  undefined8 local_38;
  double local_30;
  AssertionResult local_28;
  int local_14;
  undefined8 local_10;
  
  local_10 = value_create_int(0x1e252);
  local_14 = value_to_int(local_10);
  local_10 = value_type_cast(local_10,6);
  local_30 = (double)local_14;
  local_38 = value_to_double(local_10);
  this_00 = &local_28;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((char *)in_stack_ffffffffffffffa8.data_,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),(double *)this_00
             ,in_stack_ffffffffffffff90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x11c725);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_int_test.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffa8,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    testing::Message::~Message((Message *)0x11c773);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c7b3);
  value_destroy(local_10);
  return;
}

Assistant:

TEST_F(reflect_value_cast_int_test, int_to_double_cast)
{
	value v = value_create_int(123474);

	int i = value_to_int(v);

	v = value_type_cast(v, TYPE_DOUBLE);

	EXPECT_EQ((double)i, (double)value_to_double(v));

	value_destroy(v);
}